

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O3

bool __thiscall
pstore::maybe<unsigned_int,_void>::operator==
          (maybe<unsigned_int,_void> *this,maybe<unsigned_int,_void> *other)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  
  bVar3 = this->valid_ == other->valid_;
  if ((this->valid_ & bVar3) == 1) {
    puVar2 = maybe<unsigned_int,void>::
             value_impl<pstore::maybe<unsigned_int,void>const&,unsigned_int_const>(this);
    uVar1 = *puVar2;
    puVar2 = maybe<unsigned_int,void>::
             value_impl<pstore::maybe<unsigned_int,void>const&,unsigned_int_const>(other);
    bVar3 = uVar1 == *puVar2;
  }
  return bVar3;
}

Assistant:

T const & value () const noexcept { return value_impl (*this); }